

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::PipelineClassifier::SerializeWithCachedSizes
          (PipelineClassifier *this,CodedOutputStream *output)

{
  bool bVar1;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  PipelineClassifier *this_local;
  
  bVar1 = has_pipeline(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (1,&this->pipeline_->super_MessageLite,output);
  }
  return;
}

Assistant:

void PipelineClassifier::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.PipelineClassifier)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.Pipeline pipeline = 1;
  if (this->has_pipeline()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, *this->pipeline_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.PipelineClassifier)
}